

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# widgets.h
# Opt level: O1

void __thiscall dlib::text_field::text_field(text_field *this,drawable_window *w)

{
  popup_menu_region *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_11
  *paVar2;
  text_field_style *ptVar3;
  int iVar4;
  int iVar5;
  text_field_style *ptVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  popup_menu *ppVar7;
  string local_c8;
  menu_item_text local_a8;
  timer<dlib::text_field> *local_40;
  anon_union_16_2_edb7204a_for_basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_11
  *local_38;
  
  drawable::drawable(&this->super_drawable,w,0x93);
  (this->super_drawable)._vptr_drawable = (_func_int **)&PTR__text_field_00320428;
  local_38 = &(this->text_).field_2;
  (this->text_)._M_dataplus._M_p = (pointer)local_38;
  (this->text_)._M_string_length = 0;
  (this->text_).field_2._M_local_buf[0] = 0;
  (this->text_color_).red = '\0';
  (this->text_color_).green = '\0';
  (this->text_color_).blue = '\0';
  (this->bg_color_).red = 0xff;
  (this->bg_color_).green = 0xff;
  (this->bg_color_).blue = 0xff;
  this->cursor_pos = 0;
  this->highlight_start = 0;
  this->text_width = 0;
  this->text_pos = 0;
  *(undefined4 *)((long)&this->text_pos + 7) = 0;
  *(undefined4 *)&this->highlight_end = 0xffffffff;
  *(undefined4 *)((long)&this->highlight_end + 4) = 0xffffffff;
  *(undefined4 *)&this->shift_pos = 0xffffffff;
  *(undefined4 *)((long)&this->shift_pos + 4) = 0xffffffff;
  local_40 = &this->t;
  (this->text_modified_handler).data._M_t.
  super___uniq_ptr_impl<dlib::any_function<void_(),_void,_0UL>::Tbase<void_()>,_std::default_delete<dlib::any_function<void_(),_void,_0UL>::Tbase<void_()>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_dlib::any_function<void_(),_void,_0UL>::Tbase<void_()>_*,_std::default_delete<dlib::any_function<void_(),_void,_0UL>::Tbase<void_()>_>_>
  .super__Head_base<0UL,_dlib::any_function<void_(),_void,_0UL>::Tbase<void_()>_*,_false>.
  _M_head_impl = (Tbase<void_()> *)0x0;
  (this->enter_key_handler).data._M_t.
  super___uniq_ptr_impl<dlib::any_function<void_(),_void,_0UL>::Tbase<void_()>,_std::default_delete<dlib::any_function<void_(),_void,_0UL>::Tbase<void_()>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_dlib::any_function<void_(),_void,_0UL>::Tbase<void_()>_*,_std::default_delete<dlib::any_function<void_(),_void,_0UL>::Tbase<void_()>_>_>
  .super__Head_base<0UL,_dlib::any_function<void_(),_void,_0UL>::Tbase<void_()>_*,_false>.
  _M_head_impl = (Tbase<void_()> *)0x0;
  (this->focus_lost_handler).data._M_t.
  super___uniq_ptr_impl<dlib::any_function<void_(),_void,_0UL>::Tbase<void_()>,_std::default_delete<dlib::any_function<void_(),_void,_0UL>::Tbase<void_()>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_dlib::any_function<void_(),_void,_0UL>::Tbase<void_()>_*,_std::default_delete<dlib::any_function<void_(),_void,_0UL>::Tbase<void_()>_>_>
  .super__Head_base<0UL,_dlib::any_function<void_(),_void,_0UL>::Tbase<void_()>_*,_false>.
  _M_head_impl = (Tbase<void_()> *)0x0;
  (this->style)._M_t.
  super___uniq_ptr_impl<dlib::text_field_style,_std::default_delete<dlib::text_field_style>_>._M_t.
  super__Tuple_impl<0UL,_dlib::text_field_style_*,_std::default_delete<dlib::text_field_style>_>.
  super__Head_base<0UL,_dlib::text_field_style_*,_false>._M_head_impl = (text_field_style *)0x0;
  timer<dlib::text_field>::timer(local_40,this,(af_type)timer_action);
  this_00 = &this->right_click_menu;
  popup_menu_region::popup_menu_region(this_00,w);
  ptVar6 = (text_field_style *)operator_new(8);
  ptVar6->_vptr_text_field_style = (_func_int **)&PTR__text_field_style_00323200;
  ptVar3 = (this->style)._M_t.
           super___uniq_ptr_impl<dlib::text_field_style,_std::default_delete<dlib::text_field_style>_>
           ._M_t.
           super__Tuple_impl<0UL,_dlib::text_field_style_*,_std::default_delete<dlib::text_field_style>_>
           .super__Head_base<0UL,_dlib::text_field_style_*,_false>._M_head_impl;
  (this->style)._M_t.
  super___uniq_ptr_impl<dlib::text_field_style,_std::default_delete<dlib::text_field_style>_>._M_t.
  super__Tuple_impl<0UL,_dlib::text_field_style_*,_std::default_delete<dlib::text_field_style>_>.
  super__Head_base<0UL,_dlib::text_field_style_*,_false>._M_head_impl = ptVar6;
  if (ptVar3 != (text_field_style *)0x0) {
    (*ptVar3->_vptr_text_field_style[1])();
  }
  iVar4 = (*((this->super_drawable).mfont.super___shared_ptr<dlib::font,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr)->_vptr_font[4])();
  ptVar3 = (this->style)._M_t.
           super___uniq_ptr_impl<dlib::text_field_style,_std::default_delete<dlib::text_field_style>_>
           ._M_t.
           super__Tuple_impl<0UL,_dlib::text_field_style_*,_std::default_delete<dlib::text_field_style>_>
           .super__Head_base<0UL,_dlib::text_field_style_*,_false>._M_head_impl;
  iVar5 = (*ptVar3->_vptr_text_field_style[2])
                    (ptVar3,(this->super_drawable).mfont.
                            super___shared_ptr<dlib::font,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  (this->super_drawable).rect.b = CONCAT44(extraout_var,iVar4) + CONCAT44(extraout_var_00,iVar5) * 2
  ;
  ptVar3 = (this->style)._M_t.
           super___uniq_ptr_impl<dlib::text_field_style,_std::default_delete<dlib::text_field_style>_>
           ._M_t.
           super__Tuple_impl<0UL,_dlib::text_field_style_*,_std::default_delete<dlib::text_field_style>_>
           .super__Head_base<0UL,_dlib::text_field_style_*,_false>._M_head_impl;
  iVar4 = (*ptVar3->_vptr_text_field_style[2])
                    (ptVar3,(this->super_drawable).mfont.
                            super___shared_ptr<dlib::font,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  (this->super_drawable).rect.r = CONCAT44(extraout_var_01,iVar4) * 2;
  ptVar3 = (this->style)._M_t.
           super___uniq_ptr_impl<dlib::text_field_style,_std::default_delete<dlib::text_field_style>_>
           ._M_t.
           super__Tuple_impl<0UL,_dlib::text_field_style_*,_std::default_delete<dlib::text_field_style>_>
           .super__Head_base<0UL,_dlib::text_field_style_*,_false>._M_head_impl;
  iVar4 = (*ptVar3->_vptr_text_field_style[2])
                    (ptVar3,(this->super_drawable).mfont.
                            super___shared_ptr<dlib::font,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  this->cursor_x = CONCAT44(extraout_var_02,iVar4);
  ppVar7 = popup_menu_region::menu(this_00);
  paVar1 = &local_c8.field_2;
  local_c8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"Cut","");
  menu_item_text::menu_item_text<dlib::text_field>
            (&local_a8,&local_c8,this,(offset_in_text_field_to_subr)on_cut,0);
  popup_menu::add_menu_item<dlib::menu_item_text>(ppVar7,&local_a8);
  local_a8.super_menu_item._vptr_menu_item = (_func_int **)&PTR__menu_item_text_00321390;
  if (local_a8.action.data._M_t.
      super___uniq_ptr_impl<dlib::any_function<void_(),_void,_0UL>::Tbase<void_()>,_std::default_delete<dlib::any_function<void_(),_void,_0UL>::Tbase<void_()>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_dlib::any_function<void_(),_void,_0UL>::Tbase<void_()>_*,_std::default_delete<dlib::any_function<void_(),_void,_0UL>::Tbase<void_()>_>_>
      .super__Head_base<0UL,_dlib::any_function<void_(),_void,_0UL>::Tbase<void_()>_*,_false>.
      _M_head_impl !=
      (__uniq_ptr_data<dlib::any_function<void_(),_void,_0UL>::Tbase<void_()>,_std::default_delete<dlib::any_function<void_(),_void,_0UL>::Tbase<void_()>_>,_true,_true>
       )0x0) {
    (*(*(_func_int ***)
        local_a8.action.data._M_t.
        super___uniq_ptr_impl<dlib::any_function<void_(),_void,_0UL>::Tbase<void_()>,_std::default_delete<dlib::any_function<void_(),_void,_0UL>::Tbase<void_()>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_dlib::any_function<void_(),_void,_0UL>::Tbase<void_()>_*,_std::default_delete<dlib::any_function<void_(),_void,_0UL>::Tbase<void_()>_>_>
        .super__Head_base<0UL,_dlib::any_function<void_(),_void,_0UL>::Tbase<void_()>_*,_false>.
        _M_head_impl)[1])();
  }
  local_a8.action.data._M_t.
  super___uniq_ptr_impl<dlib::any_function<void_(),_void,_0UL>::Tbase<void_()>,_std::default_delete<dlib::any_function<void_(),_void,_0UL>::Tbase<void_()>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_dlib::any_function<void_(),_void,_0UL>::Tbase<void_()>_*,_std::default_delete<dlib::any_function<void_(),_void,_0UL>::Tbase<void_()>_>_>
  .super__Head_base<0UL,_dlib::any_function<void_(),_void,_0UL>::Tbase<void_()>_*,_false>.
  _M_head_impl = (unique_ptr<dlib::any_function<void_(),_void,_0UL>::Tbase<void_()>,_std::default_delete<dlib::any_function<void_(),_void,_0UL>::Tbase<void_()>_>_>
                  )(__uniq_ptr_data<dlib::any_function<void_(),_void,_0UL>::Tbase<void_()>,_std::default_delete<dlib::any_function<void_(),_void,_0UL>::Tbase<void_()>_>,_true,_true>
                    )0x0;
  if (local_a8.f.super___shared_ptr<dlib::font,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_a8.f.super___shared_ptr<dlib::font,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  paVar2 = &local_a8.text.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_11
       *)local_a8.text._M_dataplus._M_p != paVar2) {
    operator_delete(local_a8.text._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar1) {
    operator_delete(local_c8._M_dataplus._M_p);
  }
  ppVar7 = popup_menu_region::menu(this_00);
  local_c8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"Copy","");
  menu_item_text::menu_item_text<dlib::text_field>
            (&local_a8,&local_c8,this,(offset_in_text_field_to_subr)on_copy,0);
  popup_menu::add_menu_item<dlib::menu_item_text>(ppVar7,&local_a8);
  local_a8.super_menu_item._vptr_menu_item = (_func_int **)&PTR__menu_item_text_00321390;
  if (local_a8.action.data._M_t.
      super___uniq_ptr_impl<dlib::any_function<void_(),_void,_0UL>::Tbase<void_()>,_std::default_delete<dlib::any_function<void_(),_void,_0UL>::Tbase<void_()>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_dlib::any_function<void_(),_void,_0UL>::Tbase<void_()>_*,_std::default_delete<dlib::any_function<void_(),_void,_0UL>::Tbase<void_()>_>_>
      .super__Head_base<0UL,_dlib::any_function<void_(),_void,_0UL>::Tbase<void_()>_*,_false>.
      _M_head_impl !=
      (__uniq_ptr_data<dlib::any_function<void_(),_void,_0UL>::Tbase<void_()>,_std::default_delete<dlib::any_function<void_(),_void,_0UL>::Tbase<void_()>_>,_true,_true>
       )0x0) {
    (*(*(_func_int ***)
        local_a8.action.data._M_t.
        super___uniq_ptr_impl<dlib::any_function<void_(),_void,_0UL>::Tbase<void_()>,_std::default_delete<dlib::any_function<void_(),_void,_0UL>::Tbase<void_()>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_dlib::any_function<void_(),_void,_0UL>::Tbase<void_()>_*,_std::default_delete<dlib::any_function<void_(),_void,_0UL>::Tbase<void_()>_>_>
        .super__Head_base<0UL,_dlib::any_function<void_(),_void,_0UL>::Tbase<void_()>_*,_false>.
        _M_head_impl)[1])();
  }
  local_a8.action.data._M_t.
  super___uniq_ptr_impl<dlib::any_function<void_(),_void,_0UL>::Tbase<void_()>,_std::default_delete<dlib::any_function<void_(),_void,_0UL>::Tbase<void_()>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_dlib::any_function<void_(),_void,_0UL>::Tbase<void_()>_*,_std::default_delete<dlib::any_function<void_(),_void,_0UL>::Tbase<void_()>_>_>
  .super__Head_base<0UL,_dlib::any_function<void_(),_void,_0UL>::Tbase<void_()>_*,_false>.
  _M_head_impl = (unique_ptr<dlib::any_function<void_(),_void,_0UL>::Tbase<void_()>,_std::default_delete<dlib::any_function<void_(),_void,_0UL>::Tbase<void_()>_>_>
                  )(__uniq_ptr_data<dlib::any_function<void_(),_void,_0UL>::Tbase<void_()>,_std::default_delete<dlib::any_function<void_(),_void,_0UL>::Tbase<void_()>_>,_true,_true>
                    )0x0;
  if (local_a8.f.super___shared_ptr<dlib::font,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_a8.f.super___shared_ptr<dlib::font,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_11
       *)local_a8.text._M_dataplus._M_p != paVar2) {
    operator_delete(local_a8.text._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar1) {
    operator_delete(local_c8._M_dataplus._M_p);
  }
  ppVar7 = popup_menu_region::menu(this_00);
  local_c8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"Paste","");
  menu_item_text::menu_item_text<dlib::text_field>
            (&local_a8,&local_c8,this,(offset_in_text_field_to_subr)on_paste,0);
  popup_menu::add_menu_item<dlib::menu_item_text>(ppVar7,&local_a8);
  local_a8.super_menu_item._vptr_menu_item = (_func_int **)&PTR__menu_item_text_00321390;
  if (local_a8.action.data._M_t.
      super___uniq_ptr_impl<dlib::any_function<void_(),_void,_0UL>::Tbase<void_()>,_std::default_delete<dlib::any_function<void_(),_void,_0UL>::Tbase<void_()>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_dlib::any_function<void_(),_void,_0UL>::Tbase<void_()>_*,_std::default_delete<dlib::any_function<void_(),_void,_0UL>::Tbase<void_()>_>_>
      .super__Head_base<0UL,_dlib::any_function<void_(),_void,_0UL>::Tbase<void_()>_*,_false>.
      _M_head_impl !=
      (__uniq_ptr_data<dlib::any_function<void_(),_void,_0UL>::Tbase<void_()>,_std::default_delete<dlib::any_function<void_(),_void,_0UL>::Tbase<void_()>_>,_true,_true>
       )0x0) {
    (*(*(_func_int ***)
        local_a8.action.data._M_t.
        super___uniq_ptr_impl<dlib::any_function<void_(),_void,_0UL>::Tbase<void_()>,_std::default_delete<dlib::any_function<void_(),_void,_0UL>::Tbase<void_()>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_dlib::any_function<void_(),_void,_0UL>::Tbase<void_()>_*,_std::default_delete<dlib::any_function<void_(),_void,_0UL>::Tbase<void_()>_>_>
        .super__Head_base<0UL,_dlib::any_function<void_(),_void,_0UL>::Tbase<void_()>_*,_false>.
        _M_head_impl)[1])();
  }
  local_a8.action.data._M_t.
  super___uniq_ptr_impl<dlib::any_function<void_(),_void,_0UL>::Tbase<void_()>,_std::default_delete<dlib::any_function<void_(),_void,_0UL>::Tbase<void_()>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_dlib::any_function<void_(),_void,_0UL>::Tbase<void_()>_*,_std::default_delete<dlib::any_function<void_(),_void,_0UL>::Tbase<void_()>_>_>
  .super__Head_base<0UL,_dlib::any_function<void_(),_void,_0UL>::Tbase<void_()>_*,_false>.
  _M_head_impl = (unique_ptr<dlib::any_function<void_(),_void,_0UL>::Tbase<void_()>,_std::default_delete<dlib::any_function<void_(),_void,_0UL>::Tbase<void_()>_>_>
                  )(__uniq_ptr_data<dlib::any_function<void_(),_void,_0UL>::Tbase<void_()>,_std::default_delete<dlib::any_function<void_(),_void,_0UL>::Tbase<void_()>_>,_true,_true>
                    )0x0;
  if (local_a8.f.super___shared_ptr<dlib::font,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_a8.f.super___shared_ptr<dlib::font,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_11
       *)local_a8.text._M_dataplus._M_p != paVar2) {
    operator_delete(local_a8.text._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar1) {
    operator_delete(local_c8._M_dataplus._M_p);
  }
  ppVar7 = popup_menu_region::menu(this_00);
  local_c8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"Delete","");
  menu_item_text::menu_item_text<dlib::text_field>
            (&local_a8,&local_c8,this,(offset_in_text_field_to_subr)on_delete_selected,0);
  popup_menu::add_menu_item<dlib::menu_item_text>(ppVar7,&local_a8);
  local_a8.super_menu_item._vptr_menu_item = (_func_int **)&PTR__menu_item_text_00321390;
  if (local_a8.action.data._M_t.
      super___uniq_ptr_impl<dlib::any_function<void_(),_void,_0UL>::Tbase<void_()>,_std::default_delete<dlib::any_function<void_(),_void,_0UL>::Tbase<void_()>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_dlib::any_function<void_(),_void,_0UL>::Tbase<void_()>_*,_std::default_delete<dlib::any_function<void_(),_void,_0UL>::Tbase<void_()>_>_>
      .super__Head_base<0UL,_dlib::any_function<void_(),_void,_0UL>::Tbase<void_()>_*,_false>.
      _M_head_impl !=
      (__uniq_ptr_data<dlib::any_function<void_(),_void,_0UL>::Tbase<void_()>,_std::default_delete<dlib::any_function<void_(),_void,_0UL>::Tbase<void_()>_>,_true,_true>
       )0x0) {
    (*(*(_func_int ***)
        local_a8.action.data._M_t.
        super___uniq_ptr_impl<dlib::any_function<void_(),_void,_0UL>::Tbase<void_()>,_std::default_delete<dlib::any_function<void_(),_void,_0UL>::Tbase<void_()>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_dlib::any_function<void_(),_void,_0UL>::Tbase<void_()>_*,_std::default_delete<dlib::any_function<void_(),_void,_0UL>::Tbase<void_()>_>_>
        .super__Head_base<0UL,_dlib::any_function<void_(),_void,_0UL>::Tbase<void_()>_*,_false>.
        _M_head_impl)[1])();
  }
  local_a8.action.data._M_t.
  super___uniq_ptr_impl<dlib::any_function<void_(),_void,_0UL>::Tbase<void_()>,_std::default_delete<dlib::any_function<void_(),_void,_0UL>::Tbase<void_()>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_dlib::any_function<void_(),_void,_0UL>::Tbase<void_()>_*,_std::default_delete<dlib::any_function<void_(),_void,_0UL>::Tbase<void_()>_>_>
  .super__Head_base<0UL,_dlib::any_function<void_(),_void,_0UL>::Tbase<void_()>_*,_false>.
  _M_head_impl = (unique_ptr<dlib::any_function<void_(),_void,_0UL>::Tbase<void_()>,_std::default_delete<dlib::any_function<void_(),_void,_0UL>::Tbase<void_()>_>_>
                  )(__uniq_ptr_data<dlib::any_function<void_(),_void,_0UL>::Tbase<void_()>,_std::default_delete<dlib::any_function<void_(),_void,_0UL>::Tbase<void_()>_>,_true,_true>
                    )0x0;
  if (local_a8.f.super___shared_ptr<dlib::font,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_a8.f.super___shared_ptr<dlib::font,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_11
       *)local_a8.text._M_dataplus._M_p != paVar2) {
    operator_delete(local_a8.text._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar1) {
    operator_delete(local_c8._M_dataplus._M_p);
  }
  ppVar7 = popup_menu_region::menu(this_00);
  local_a8.super_menu_item._vptr_menu_item = (_func_int **)&PTR__menu_item_00321520;
  popup_menu::add_menu_item<dlib::menu_item_separator>(ppVar7,(menu_item_separator *)&local_a8);
  ppVar7 = popup_menu_region::menu(this_00);
  local_c8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"Select All","");
  menu_item_text::menu_item_text<dlib::text_field>
            (&local_a8,&local_c8,this,(offset_in_text_field_to_subr)on_select_all,0);
  popup_menu::add_menu_item<dlib::menu_item_text>(ppVar7,&local_a8);
  local_a8.super_menu_item._vptr_menu_item = (_func_int **)&PTR__menu_item_text_00321390;
  if ((_Head_base<0UL,_dlib::any_function<void_(),_void,_0UL>::Tbase<void_()>_*,_false>)
      local_a8.action.data._M_t.
      super___uniq_ptr_impl<dlib::any_function<void_(),_void,_0UL>::Tbase<void_()>,_std::default_delete<dlib::any_function<void_(),_void,_0UL>::Tbase<void_()>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_dlib::any_function<void_(),_void,_0UL>::Tbase<void_()>_*,_std::default_delete<dlib::any_function<void_(),_void,_0UL>::Tbase<void_()>_>_>
      .super__Head_base<0UL,_dlib::any_function<void_(),_void,_0UL>::Tbase<void_()>_*,_false>.
      _M_head_impl !=
      (_Head_base<0UL,_dlib::any_function<void_(),_void,_0UL>::Tbase<void_()>_*,_false>)0x0) {
    (*(*(_func_int ***)
        local_a8.action.data._M_t.
        super___uniq_ptr_impl<dlib::any_function<void_(),_void,_0UL>::Tbase<void_()>,_std::default_delete<dlib::any_function<void_(),_void,_0UL>::Tbase<void_()>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_dlib::any_function<void_(),_void,_0UL>::Tbase<void_()>_*,_std::default_delete<dlib::any_function<void_(),_void,_0UL>::Tbase<void_()>_>_>
        .super__Head_base<0UL,_dlib::any_function<void_(),_void,_0UL>::Tbase<void_()>_*,_false>.
        _M_head_impl)[1])();
  }
  local_a8.action.data._M_t.
  super___uniq_ptr_impl<dlib::any_function<void_(),_void,_0UL>::Tbase<void_()>,_std::default_delete<dlib::any_function<void_(),_void,_0UL>::Tbase<void_()>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_dlib::any_function<void_(),_void,_0UL>::Tbase<void_()>_*,_std::default_delete<dlib::any_function<void_(),_void,_0UL>::Tbase<void_()>_>_>
  .super__Head_base<0UL,_dlib::any_function<void_(),_void,_0UL>::Tbase<void_()>_*,_false>.
  _M_head_impl = (unique_ptr<dlib::any_function<void_(),_void,_0UL>::Tbase<void_()>,_std::default_delete<dlib::any_function<void_(),_void,_0UL>::Tbase<void_()>_>_>
                  )(__uniq_ptr_data<dlib::any_function<void_(),_void,_0UL>::Tbase<void_()>,_std::default_delete<dlib::any_function<void_(),_void,_0UL>::Tbase<void_()>_>,_true,_true>
                    )0x0;
  if (local_a8.f.super___shared_ptr<dlib::font,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_a8.f.super___shared_ptr<dlib::font,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_11
       *)local_a8.text._M_dataplus._M_p != paVar2) {
    operator_delete(local_a8.text._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar1) {
    operator_delete(local_c8._M_dataplus._M_p);
  }
  get_text_rect((rectangle *)&local_a8,this);
  popup_menu_region::set_rect(this_00,(rectangle *)&local_a8);
  drawable::enable_events(&this->super_drawable);
  timer<dlib::text_field>::set_delay_time(local_40,500);
  return;
}

Assistant:

text_field(
            drawable_window& w
        ) : 
            drawable(w,MOUSE_CLICK | KEYBOARD_EVENTS | MOUSE_MOVE | STRING_PUT),
            text_color_(0,0,0),
            bg_color_(255,255,255),
            text_width(0),
            text_pos(0),
            recent_movement(false),
            has_focus(false),
            cursor_visible(false),
            cursor_pos(0),
            highlight_start(0),
            highlight_end(-1),
            shift_pos(-1),
            t(*this,&text_field::timer_action),
            right_click_menu(w)
        {
            style.reset(new text_field_style_default());
            rect.set_bottom(mfont->height()+ (style->get_padding(*mfont))*2);
            rect.set_right((style->get_padding(*mfont))*2);
            cursor_x = style->get_padding(*mfont);

            right_click_menu.menu().add_menu_item(menu_item_text("Cut",*this,&text_field::on_cut,'t'));
            right_click_menu.menu().add_menu_item(menu_item_text("Copy",*this,&text_field::on_copy,'C'));
            right_click_menu.menu().add_menu_item(menu_item_text("Paste",*this,&text_field::on_paste,'P'));
            right_click_menu.menu().add_menu_item(menu_item_text("Delete",*this,&text_field::on_delete_selected,'D'));
            right_click_menu.menu().add_menu_item(menu_item_separator());
            right_click_menu.menu().add_menu_item(menu_item_text("Select All",*this,&text_field::on_select_all,'A'));

            right_click_menu.set_rect(get_text_rect());
            enable_events();

            t.set_delay_time(500);
        }